

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O0

bool Refal2::CReceptacle::IsValidKeyValue(CUnitList *keyValue)

{
  bool bVar1;
  CUnitNode *local_28;
  CUnitNode *node;
  int depth;
  CUnitList *keyValue_local;
  
  node._4_4_ = 0;
  local_28 = CNodeList<Refal2::CUnit>::GetFirst(&keyValue->super_CNodeList<Refal2::CUnit>);
  while( true ) {
    if (local_28 == (CUnitNode *)0x0) {
      return false;
    }
    if ((node._4_4_ == 0) && (bVar1 = isEqualNode(local_28), bVar1)) break;
    bVar1 = CUnit::IsLeftParen(&local_28->super_CUnit);
    if (bVar1) {
      node._4_4_ = node._4_4_ + 1;
    }
    else {
      bVar1 = CUnit::IsRightParen(&local_28->super_CUnit);
      if (bVar1) {
        if (node._4_4_ < 1) {
          __assert_fail("depth > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                        ,0x60,"static bool Refal2::CReceptacle::IsValidKeyValue(const CUnitList &)")
          ;
        }
        node._4_4_ = node._4_4_ + -1;
      }
    }
    local_28 = CNode<Refal2::CUnit>::Next(local_28);
  }
  return true;
}

Assistant:

bool CReceptacle::IsValidKeyValue( const CUnitList& keyValue )
{
	int depth = 0;
	const CUnitNode* node = keyValue.GetFirst();
	while( node != nullptr ) {
		if( depth == 0 && isEqualNode( node ) ) {
			return true;
		}
		if( node->IsLeftParen() ) {
			depth++;
		} else if( node->IsRightParen() ) {
			assert( depth > 0 );
			depth--;
		}
		node = node->Next();
	}
	return false;
}